

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O3

int duckdb_shell_sqlite3_prepare_v2
              (sqlite3 *db,char *zSql,int nByte,sqlite3_stmt **ppStmt,char **pzTail)

{
  unsigned_long __val;
  _Head_base<0UL,_duckdb::PendingQueryResult_*,_false> _Var1;
  ParserOptions options_p;
  ExceptionType EVar2;
  sqlite3 *psVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  size_t sVar7;
  pointer pCVar8;
  ClientContext *pCVar9;
  reference pvVar10;
  pointer pSVar11;
  pointer pMVar12;
  pointer psVar13;
  pointer pPVar14;
  pointer pPVar15;
  ErrorData *pEVar16;
  __uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
  *p_Var17;
  unsigned_long uVar18;
  __uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_> _Var19
  ;
  int iVar20;
  size_type __n;
  ulong uVar21;
  char cVar22;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  statements;
  string query;
  string __str;
  Parser parser;
  _Head_base<0UL,_sqlite3_stmt_*,_false> local_1c8;
  sqlite3 *local_1c0;
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *local_1b8;
  SQLStatement *local_1b0;
  idx_t local_1a8;
  char *local_1a0;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_198;
  SQLStatement *local_190;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_188;
  char **local_168;
  string local_160;
  char *local_140;
  uint local_138;
  char local_130 [16];
  ulong local_120;
  sqlite3_stmt **local_118;
  undefined1 local_110 [24];
  _Head_base<0UL,_duckdb::PreparedStatement_*,_false> _Stack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [3];
  ParserOptions local_60;
  LogicalType local_48;
  
  if (zSql == (char *)0x0) {
    return 0x15;
  }
  if (db == (sqlite3 *)0x0) {
    return 0x15;
  }
  if (ppStmt == (sqlite3_stmt **)0x0) {
    return 0x15;
  }
  *ppStmt = (sqlite3_stmt *)0x0;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_1c0 = db;
  local_1a0 = zSql;
  local_168 = pzTail;
  local_118 = ppStmt;
  if (nByte < 0) {
    sVar7 = strlen(zSql);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,zSql,zSql + sVar7);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,zSql,zSql + (uint)nByte);
  }
  if (local_168 != (char **)0x0) {
    *local_168 = local_1a0 + local_160._M_string_length;
  }
  local_1b8 = &local_1c0->con;
  pCVar8 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
           operator->(local_1b8);
  pCVar9 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(&pCVar8->context);
  duckdb::ClientContext::GetParserOptions(&local_60,pCVar9);
  options_p.max_expression_depth = local_60.max_expression_depth;
  options_p.preserve_identifier_case = local_60.preserve_identifier_case;
  options_p.integer_division = local_60.integer_division;
  options_p._2_6_ = local_60._2_6_;
  options_p.extensions = local_60.extensions;
  duckdb::Parser::Parser((Parser *)local_90,options_p);
  duckdb::Parser::ParseQuery((Parser *)local_90,&local_160);
  if (local_90[0]._8_8_ == local_90[0]._M_allocated_capacity) {
    iVar20 = 0;
    goto LAB_00cf92c5;
  }
  pvVar10 = duckdb::
            vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                          *)local_90,0);
  pSVar11 = duckdb::
            unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
            operator->(pvVar10);
  local_1a8 = pSVar11->stmt_location;
  pvVar10 = duckdb::
            vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                          *)local_90,0);
  pSVar11 = duckdb::
            unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
            operator->(pvVar10);
  local_1a8 = local_1a8 + pSVar11->stmt_length;
  local_120 = local_160._M_string_length;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar10 = duckdb::
            vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                          *)local_90,0);
  std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>
            ((vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
              *)&local_188,pvVar10);
  pCVar8 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
           operator->(local_1b8);
  pCVar9 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(&pCVar8->context);
  duckdb::ClientContext::HandlePragmaStatements
            (pCVar9,(vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                     *)&local_188);
  if (local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00cf92b9:
    iVar20 = 0;
  }
  else {
    if (8 < (ulong)((long)local_188.
                          super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_188.
                         super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      __n = 0;
      do {
        pCVar8 = duckdb::
                 unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
                 operator->(local_1b8);
        pvVar10 = duckdb::
                  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                                *)&local_188,__n);
        local_1b0 = (pvVar10->
                    super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                    .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
        (pvVar10->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
        super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
        duckdb::Connection::Query
                  ((Connection *)local_110,
                   (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                    *)pCVar8);
        if (local_1b0 != (SQLStatement *)0x0) {
          (*local_1b0->_vptr_SQLStatement[1])();
        }
        local_1b0 = (SQLStatement *)0x0;
        pMVar12 = duckdb::
                  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                *)local_110);
        bVar6 = duckdb::BaseQueryResult::HasError((BaseQueryResult *)pMVar12);
        psVar3 = local_1c0;
        if (bVar6) {
          pMVar12 = duckdb::
                    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                  *)local_110);
          pEVar16 = duckdb::BaseQueryResult::GetErrorObject((BaseQueryResult *)pMVar12);
          EVar2 = pEVar16->type;
          (psVar3->last_error).initialized = pEVar16->initialized;
          (psVar3->last_error).type = EVar2;
          std::__cxx11::string::_M_assign((string *)&(psVar3->last_error).raw_message);
          std::__cxx11::string::_M_assign((string *)&(psVar3->last_error).final_message);
          if (pEVar16 != &psVar3->last_error) {
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&(psVar3->last_error).extra_info,&(pEVar16->extra_info)._M_h);
          }
          if ((_Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
               )local_110._0_8_ != (PreparedStatement *)0x0) {
            (**(code **)(*(long *)local_110._0_8_ + 8))();
          }
          iVar20 = 1;
          goto LAB_00cf92bb;
        }
        if ((element_type *)local_110._0_8_ != (element_type *)0x0) {
          (*((BaseQueryResult *)local_110._0_8_)->_vptr_BaseQueryResult[1])();
        }
        uVar21 = __n + 2;
        __n = __n + 1;
      } while (uVar21 < (ulong)((long)local_188.
                                      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_188.
                                      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    local_1c8._M_head_impl = (sqlite3_stmt *)operator_new(0x88);
    (local_1c8._M_head_impl)->db = (sqlite3 *)0x0;
    ((local_1c8._M_head_impl)->query_string)._M_dataplus._M_p = (pointer)0x0;
    ((local_1c8._M_head_impl)->pending).
    super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
    .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl =
         (PendingQueryResult *)0x0;
    ((local_1c8._M_head_impl)->result).
    super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
    super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = (QueryResult *)0x0;
    *(undefined8 *)((long)&((local_1c8._M_head_impl)->query_string).field_2 + 8) = 0;
    ((local_1c8._M_head_impl)->prepared).
    super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
    .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl =
         (PreparedStatement *)0x0;
    ((local_1c8._M_head_impl)->current_chunk).
    super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
    super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = (DataChunk *)0x0;
    (local_1c8._M_head_impl)->current_row = 0;
    ((local_1c8._M_head_impl)->query_string)._M_string_length = 0;
    ((local_1c8._M_head_impl)->query_string).field_2._M_allocated_capacity = 0;
    ((local_1c8._M_head_impl)->query_string)._M_dataplus._M_p =
         (pointer)&((local_1c8._M_head_impl)->query_string).field_2;
    ((local_1c8._M_head_impl)->prepared).
    super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
    .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl =
         (PreparedStatement *)0x0;
    ((local_1c8._M_head_impl)->pending).
    super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
    .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl =
         (PendingQueryResult *)0x0;
    ((local_1c8._M_head_impl)->result).
    super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
    super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = (QueryResult *)0x0;
    ((local_1c8._M_head_impl)->current_chunk).
    super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
    super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = (DataChunk *)0x0;
    ((local_1c8._M_head_impl)->bound_values).
    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_1c8._M_head_impl)->bound_values).
    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_1c8._M_head_impl)->bound_values).
    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_1c8._M_head_impl)->bound_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_1c8._M_head_impl)->bound_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_1c8._M_head_impl)->bound_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_1c8._M_head_impl)->current_text).
    super_unique_ptr<sqlite3_string_buffer[],_std::default_delete<sqlite3_string_buffer[]>_>._M_t.
    super___uniq_ptr_impl<sqlite3_string_buffer,_std::default_delete<sqlite3_string_buffer[]>_>._M_t
    .super__Tuple_impl<0UL,_sqlite3_string_buffer_*,_std::default_delete<sqlite3_string_buffer[]>_>.
    super__Head_base<0UL,_sqlite3_string_buffer_*,_false>._M_head_impl =
         (sqlite3_string_buffer *)0x0;
    psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::operator->
                        ((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                         &local_1c8);
    psVar13->db = local_1c0;
    psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::operator->
                        ((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                         &local_1c8);
    std::__cxx11::string::_M_assign((string *)&psVar13->query_string);
    pvVar10 = duckdb::
              vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
              ::back((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                      *)&local_188);
    pSVar11 = duckdb::
              unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
              operator->(pvVar10);
    if ((pSVar11->named_param_map)._M_h._M_element_count == 0) {
      pCVar8 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
               ::operator->(local_1b8);
      pvVar10 = duckdb::
                vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                ::back((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                        *)&local_188);
      local_198._M_head_impl =
           (pvVar10->
           super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
           super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
           .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
      (pvVar10->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
      _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
      duckdb::Connection::PendingQuery
                ((Connection *)local_110,
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)pCVar8,SUB81(&local_198,0));
      if (local_198._M_head_impl != (SQLStatement *)0x0) {
        (*(local_198._M_head_impl)->_vptr_SQLStatement[1])();
      }
      local_198._M_head_impl = (SQLStatement *)0x0;
      pPVar15 = duckdb::
                unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                              *)local_110);
      bVar6 = duckdb::BaseQueryResult::HasError(&pPVar15->super_BaseQueryResult);
      if (bVar6) {
        pPVar15 = duckdb::
                  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                  ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                *)local_110);
        pEVar16 = duckdb::BaseQueryResult::GetErrorObject(&pPVar15->super_BaseQueryResult);
        EVar2 = pEVar16->type;
        (local_1c0->last_error).initialized = pEVar16->initialized;
        (local_1c0->last_error).type = EVar2;
        std::__cxx11::string::_M_assign((string *)&(local_1c0->last_error).raw_message);
        std::__cxx11::string::_M_assign((string *)&(local_1c0->last_error).final_message);
        if (pEVar16 != &local_1c0->last_error) {
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&(local_1c0->last_error).extra_info,&(pEVar16->extra_info)._M_h);
        }
LAB_00cf903c:
        if ((element_type *)local_110._0_8_ != (element_type *)0x0) {
          (*((BaseQueryResult *)local_110._0_8_)->_vptr_BaseQueryResult[1])();
        }
        goto LAB_00cf904f;
      }
      psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                           &local_1c8);
      uVar4 = local_110._0_8_;
      local_110._0_8_ = (element_type *)0x0;
      _Var1._M_head_impl =
           (psVar13->pending).
           super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
           .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl;
      (psVar13->pending).
      super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
      .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl =
           (PendingQueryResult *)uVar4;
      if (_Var1._M_head_impl != (PendingQueryResult *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseQueryResult + 8))();
        goto LAB_00cf903c;
      }
LAB_00cf9075:
      psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                           &local_1c8);
      psVar13->current_row = -1;
      psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                           &local_1c8);
      if ((psVar13->prepared).
          super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
          .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl !=
          (PreparedStatement *)0x0) {
        uVar21 = 0;
        while( true ) {
          psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                    operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                               &local_1c8);
          pPVar14 = duckdb::
                    unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                    ::operator->(&psVar13->prepared);
          if ((pPVar14->named_param_map)._M_h._M_element_count <= uVar21) break;
          psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                    operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                               &local_1c8);
          __val = uVar21 + 1;
          cVar22 = '\x01';
          if (8 < uVar21) {
            uVar18 = __val;
            cVar5 = '\x04';
            do {
              cVar22 = cVar5;
              if (uVar18 < 100) {
                cVar22 = cVar22 + -2;
                goto LAB_00cf9144;
              }
              if (uVar18 < 1000) {
                cVar22 = cVar22 + -1;
                goto LAB_00cf9144;
              }
              if (uVar18 < 10000) goto LAB_00cf9144;
              bVar6 = 99999 < uVar18;
              uVar18 = uVar18 / 10000;
              cVar5 = cVar22 + '\x04';
            } while (bVar6);
            cVar22 = cVar22 + '\x01';
          }
LAB_00cf9144:
          local_140 = local_130;
          std::__cxx11::string::_M_construct((ulong)&local_140,cVar22);
          std::__detail::__to_chars_10_impl<unsigned_long>(local_140,local_138,__val);
          p_Var17 = (__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                     *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x1d84739);
          local_110._0_8_ = (long)local_110 + 0x10;
          _Var19._M_t.
          super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
          .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl =
               (tuple<duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>)
               (p_Var17 + 2);
          if ((_Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
               )p_Var17->_M_t ==
              (_Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
               )_Var19._M_t.
                super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl) {
            local_110._16_8_ =
                 *(undefined8 *)
                  _Var19._M_t.
                  super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                  .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl;
            _Stack_f8._M_head_impl = *(PreparedStatement **)&p_Var17[3]._M_t;
          }
          else {
            local_110._16_8_ =
                 *(undefined8 *)
                  _Var19._M_t.
                  super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                  .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl;
            local_110._0_8_ =
                 (_Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                  )p_Var17->_M_t;
          }
          local_110._8_8_ = p_Var17[1]._M_t;
          p_Var17->_M_t =
               _Var19._M_t.
               super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
               .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl;
          p_Var17[1]._M_t =
               (tuple<duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>)
               0x0;
          *(undefined1 *)&p_Var17[2]._M_t = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &psVar13->bound_names,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110)
          ;
          if ((element_type *)local_110._0_8_ != (element_type *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          if (local_140 != local_130) {
            operator_delete(local_140);
          }
          psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                    operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                               &local_1c8);
          duckdb::LogicalType::LogicalType(&local_48,SQLNULL);
          duckdb::Value::Value((Value *)local_110,&local_48);
          std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&psVar13->bound_values
                     ,(Value *)local_110);
          duckdb::Value::~Value((Value *)local_110);
          duckdb::LogicalType::~LogicalType(&local_48);
          uVar21 = __val;
        }
      }
      if ((local_168 != (char **)0x0) && (local_1a8 < local_120)) {
        *local_168 = local_1a0 + local_1a8 + 1;
      }
      *local_118 = local_1c8._M_head_impl;
      goto LAB_00cf92b9;
    }
    pCVar8 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
             operator->(local_1b8);
    pvVar10 = duckdb::
              vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
              ::back((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                      *)&local_188);
    local_190 = (pvVar10->
                super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
                _M_t.
                super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
    (pvVar10->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
    _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
    super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
    duckdb::Connection::Prepare
              ((Connection *)local_110,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               pCVar8);
    if (local_190 != (SQLStatement *)0x0) {
      (*local_190->_vptr_SQLStatement[1])();
    }
    local_190 = (SQLStatement *)0x0;
    pPVar14 = duckdb::
              unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
              ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                            *)local_110);
    bVar6 = duckdb::PreparedStatement::HasError(pPVar14);
    if (bVar6) {
      pPVar14 = duckdb::
                unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                              *)local_110);
      EVar2 = (pPVar14->error).type;
      (local_1c0->last_error).initialized = (pPVar14->error).initialized;
      (local_1c0->last_error).type = EVar2;
      std::__cxx11::string::_M_assign((string *)&(local_1c0->last_error).raw_message);
      std::__cxx11::string::_M_assign((string *)&(local_1c0->last_error).final_message);
      if (&pPVar14->error != &local_1c0->last_error) {
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&(local_1c0->last_error).extra_info,&(pPVar14->error).extra_info._M_h);
      }
    }
    else {
      psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                           &local_1c8);
      uVar4 = local_110._0_8_;
      local_110._0_8_ = (PreparedStatement *)0x0;
      std::
      __uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>::
      reset((__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
             *)&psVar13->prepared,(pointer)uVar4);
    }
    uVar4 = local_110._0_8_;
    if ((__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        )local_110._0_8_ !=
        (__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        )0x0) {
      duckdb::PreparedStatement::~PreparedStatement((PreparedStatement *)local_110._0_8_);
      operator_delete((void *)uVar4);
    }
LAB_00cf904f:
    if (bVar6 == false) goto LAB_00cf9075;
    iVar20 = 1;
    if (local_1c8._M_head_impl != (sqlite3_stmt *)0x0) {
      std::default_delete<sqlite3_stmt>::operator()
                ((default_delete<sqlite3_stmt> *)&local_1c8,local_1c8._M_head_impl);
    }
  }
LAB_00cf92bb:
  std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector(&local_188);
LAB_00cf92c5:
  std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
             *)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  return iVar20;
}

Assistant:

int sqlite3_prepare_v2(sqlite3 *db,           /* Database handle */
                       const char *zSql,      /* SQL statement, UTF-8 encoded */
                       int nByte,             /* Maximum length of zSql in bytes. */
                       sqlite3_stmt **ppStmt, /* OUT: Statement handle */
                       const char **pzTail    /* OUT: Pointer to unused portion of zSql */
) {
	if (!db || !ppStmt || !zSql) {
		return SQLITE_MISUSE;
	}
	*ppStmt = nullptr;
	string query = nByte < 0 ? zSql : string(zSql, nByte);
	if (pzTail) {
		*pzTail = zSql + query.size();
	}
	try {
		Parser parser(db->con->context->GetParserOptions());
		parser.ParseQuery(query);
		if (parser.statements.size() == 0) {
			return SQLITE_OK;
		}
		// extract the remainder
		idx_t next_location = parser.statements[0]->stmt_location + parser.statements[0]->stmt_length;
		bool set_remainder = next_location < query.size();

		// extract the first statement
		duckdb::vector<duckdb::unique_ptr<SQLStatement>> statements;
		statements.push_back(std::move(parser.statements[0]));

		db->con->context->HandlePragmaStatements(statements);
		if (statements.empty()) {
			return SQLITE_OK;
		}

		// if there are multiple statements here, we are dealing with an import database statement
		// we directly execute all statements besides the final one
		for (idx_t i = 0; i + 1 < statements.size(); i++) {
			auto res = db->con->Query(std::move(statements[i]));
			if (res->HasError()) {
				db->last_error = res->GetErrorObject();
				return SQLITE_ERROR;
			}
		}

		// create the statement entry
		duckdb::unique_ptr<sqlite3_stmt> stmt = make_uniq<sqlite3_stmt>();
		stmt->db = db;
		stmt->query_string = query;

		if (!statements.back()->named_param_map.empty()) {
			// Use Prepare: there are parameters
			auto prepared = db->con->Prepare(std::move(statements.back()));
			if (prepared->HasError()) {
				// failed to prepare: set the error message
				db->last_error = prepared->error;
				return SQLITE_ERROR;
			}
			stmt->prepared = std::move(prepared);
		} else {
			// Use eager execution: there are no parameters so we can safely create a PendingQuery here
			auto pending = db->con->PendingQuery(std::move(statements.back()), false);
			if (pending->HasError()) {
				// failed to prepare: set the error message
				db->last_error = pending->GetErrorObject();
				return SQLITE_ERROR;
			}
			stmt->pending = std::move(pending);
		}

		stmt->current_row = -1;

		if (stmt->prepared) {
			for (idx_t i = 0; i < stmt->prepared->named_param_map.size(); i++) {
				stmt->bound_names.push_back("$" + to_string(i + 1));
				stmt->bound_values.push_back(Value());
			}
		}

		// extract the remainder of the query and assign it to the pzTail
		if (pzTail && set_remainder) {
			*pzTail = zSql + next_location + 1;
		}

		*ppStmt = stmt.release();
		return SQLITE_OK;
	} catch (std::exception &ex) {
		db->last_error = ErrorData(ex);
		db->con->context->ProcessError(db->last_error, query);
		return SQLITE_ERROR;
	}
}